

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.cpp
# Opt level: O2

size_t wasm::ThreadPool::getNumCores(void)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  string local_38;
  allocator<char> local_11;
  
  iVar1 = std::thread::hardware_concurrency();
  sVar2 = (size_t)(iVar1 + (uint)(iVar1 == 0));
  __s = getenv("BINARYEN_CORES");
  if (__s != (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,__s,&local_11);
    iVar1 = std::__cxx11::stoi(&local_38,(size_t *)0x0,10);
    sVar2 = (size_t)iVar1;
    std::__cxx11::string::~string((string *)&local_38);
  }
  return sVar2;
}

Assistant:

size_t ThreadPool::getNumCores() {
#if defined(__EMSCRIPTEN__) && !defined(__EMSCRIPTEN_PTHREADS__)
  // In an Emscripten build without pthreads support, avoid the overhead of
  // including support code for the below runtime checks.
  return 1;
#else
  size_t num = std::max(1U, std::thread::hardware_concurrency());
  if (getenv("BINARYEN_CORES")) {
    num = std::stoi(getenv("BINARYEN_CORES"));
  }
  return num;
#endif
}